

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

int __thiscall GB::Disassemble(GB *this,u16 addr,char *buffer,size_t size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *__s;
  ulong uVar7;
  char bytes [2] [3];
  char bank [3];
  char temp [64];
  
  bytes[1][1] = ' ';
  bytes[1][2] = '\0';
  bytes[0][0] = ' ';
  bytes[0][1] = ' ';
  bytes[0][2] = '\0';
  bytes[1][0] = ' ';
  bVar2 = Read(this,addr);
  uVar7 = (ulong)bVar2;
  bVar1 = "\x01\x03\x01\x01\x01\x01\x02\x01\x03\x01\x01\x01\x01\x01\x02\x01\x01\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x03\x01\x02\x01\x01\x01\x03\x02\x03\x03\x02\x01\x01\x01\x03"
          [uVar7];
  switch(bVar1) {
  case 0:
    __s = "*INVALID*";
    goto LAB_0010b3f9;
  case 1:
    __s = s_opcode_mnemonic[uVar7];
    goto LAB_0010b3f9;
  case 2:
    bVar3 = Read(this,addr + 1);
    uVar6 = (ulong)bVar3;
    bytes[0][1] = "0123456789abcdef"[bVar3 & 0xf];
    bytes[0][0] = "0123456789abcdef"[bVar3 >> 4];
    if (bVar2 == 0xcb) {
      __s = _ZL20s_cb_opcode_mnemonic_rel + *(int *)(_ZL20s_cb_opcode_mnemonic_rel + uVar6 * 4);
      goto LAB_0010b3f9;
    }
    break;
  case 3:
    bVar2 = Read(this,addr + 1);
    bVar3 = Read(this,addr + 2);
    uVar6 = (ulong)CONCAT11(bVar3,bVar2);
    bytes[0][1] = "0123456789abcdef"[bVar2 & 0xf];
    bytes[0][0] = "0123456789abcdef"[bVar2 >> 4];
    bytes[1][0] = "0123456789abcdef"[bVar3 >> 4];
    bytes[1][1] = "0123456789abcdef"[bVar3 & 0xf];
    break;
  default:
    __assert_fail("!\"invalid opcode byte length.\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/binji[P]gabby/src/gabby.cc"
                  ,0x837,"int GB::Disassemble(u16, char *, size_t)");
  }
  __s = temp;
  snprintf(__s,0x40,s_opcode_mnemonic[uVar7],uVar6);
LAB_0010b3f9:
  bank[2] = '\0';
  bank[0] = '?';
  bank[1] = '?';
  lVar5 = 0x5ad0;
  if ((addr < 0x4000) || (lVar5 = 0x5ad8, -1 < (short)addr)) {
    uVar4 = *(int *)((long)&(this->rom).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar5) -
            *(int *)&(this->rom).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    bank[1] = "0123456789abcdef"[uVar4 >> 0xe & 0xf];
    bank[0] = "0123456789abcdef"[uVar4 >> 0x12 & 0xf];
  }
  snprintf(buffer,size,"[%s]%#06x: %02x %s %s  %-15s",bank,addr,uVar7,bytes,bytes + 1,__s);
  bVar2 = 1;
  if (1 < bVar1) {
    bVar2 = bVar1;
  }
  return (int)bVar2;
}

Assistant:

int GB::Disassemble(u16 addr, char* buffer, size_t size) {
  char temp[64];
  char bytes[][3] = {"  ", "  "};
  const char* mnemonic = "*INVALID*";

  u8 opcode = Read(addr);
  u8 num_bytes = s_opcode_bytes[opcode];
  switch (num_bytes) {
    case 0: break;
    case 1: mnemonic = s_opcode_mnemonic[opcode]; break;
    case 2: {
      u8 byte = Read(addr + 1);
      sprint_hex(bytes[0], byte);
      if (opcode == 0xcb) {
        mnemonic = s_cb_opcode_mnemonic[byte];
      } else {
        snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode], byte);
        mnemonic = temp;
      }
      break;
    }
    case 3: {
      u8 byte1 = Read(addr + 1);
      u8 byte2 = Read(addr + 2);
      sprint_hex(bytes[0], byte1);
      sprint_hex(bytes[1], byte2);
      snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode],
               (byte2 << 8) | byte1);
      mnemonic = temp;
      break;
    }
    default: assert(!"invalid opcode byte length.\n"); break;
  }

  char bank[3] = "??";
  if ((addr >> 12) < 4) {
    sprint_hex(bank, (s.rom0p - rom.data()) >> 14);
  } else if ((addr >> 12) < 8) {
    sprint_hex(bank, (s.rom1p - rom.data()) >> 14);
  }

  snprintf(buffer, size, "[%s]%#06x: %02x %s %s  %-15s", bank, addr, opcode,
           bytes[0], bytes[1], mnemonic);
  return num_bytes ? num_bytes : 1;
}